

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

void __thiscall duckdb_snappy::SnappyIOVecReader::Advance(SnappyIOVecReader *this)

{
  size_t sVar1;
  iovec *piVar2;
  size_t sVar3;
  iovec *piVar4;
  size_t sVar5;
  
  sVar5 = this->curr_size_remaining_;
  sVar3 = this->total_size_remaining_;
  piVar2 = this->curr_iov_;
  do {
    piVar4 = piVar2 + 1;
    sVar3 = sVar3 - sVar5;
    if (sVar3 == 0) {
      this->total_size_remaining_ = 0;
      this->curr_pos_ = (char *)0x0;
      this->curr_size_remaining_ = 0;
      return;
    }
    this->curr_iov_ = piVar4;
    this->curr_pos_ = (char *)piVar4->iov_base;
    sVar1 = piVar2[1].iov_len;
    this->curr_size_remaining_ = sVar1;
    sVar5 = 0;
    piVar2 = piVar4;
  } while (sVar1 == 0);
  this->total_size_remaining_ = sVar3;
  return;
}

Assistant:

void Advance() {
    do {
      assert(total_size_remaining_ >= curr_size_remaining_);
      total_size_remaining_ -= curr_size_remaining_;
      if (total_size_remaining_ == 0) {
        curr_pos_ = nullptr;
        curr_size_remaining_ = 0;
        return;
      }
      ++curr_iov_;
      curr_pos_ = reinterpret_cast<const char*>(curr_iov_->iov_base);
      curr_size_remaining_ = curr_iov_->iov_len;
    } while (curr_size_remaining_ == 0);
  }